

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BMPReader.cpp
# Opt level: O1

int __thiscall BMPReader::open(BMPReader *this,char *__file,int __oflag,...)

{
  uint uVar1;
  FILE *__stream;
  size_t sVar2;
  RGB *pRVar3;
  uint uVar4;
  ulong uVar5;
  char *__format;
  int iVar6;
  uint infoHeaderSize;
  BitMapFileHeader fileHeader;
  BitMapCoreHeader bitMapCoreHeader;
  int local_64;
  short local_60;
  undefined4 uStack_5e;
  undefined2 uStack_5a;
  undefined2 uStack_58;
  uint uStack_56;
  undefined1 local_50 [4];
  uint local_4c;
  undefined4 local_48;
  short local_42;
  
  __stream = fopen(*(char **)__file,"rb");
  if (__stream == (FILE *)0x0) {
    printf("error occured when opening file:%s",*(undefined8 *)__file);
    return 0;
  }
  uStack_58 = 0;
  uStack_56 = 0;
  local_60 = 0;
  uStack_5e = 0;
  uStack_5a = 0;
  sVar2 = fread(&local_60,0xe,1,__stream);
  if (sVar2 != 1) {
    __format = "Error - error occured when reading BITMAPFILEHEADER";
    goto LAB_0010388b;
  }
  if (local_60 != 0x4d42) {
    __format = "Error - this is not a BMP file that you\'re reading";
    goto LAB_0010388b;
  }
  fread(&local_64,4,1,__stream);
  fseek(__stream,-4,1);
  if (local_64 == 0xc) {
    local_48 = 0x180001;
    sVar2 = fread(local_50,0xc,1,__stream);
    if (sVar2 != 1) {
LAB_00103884:
      __format = "Error - mal-structure BITMAPINFOHEADER";
      goto LAB_0010388b;
    }
    this->width = local_4c & 0xffff;
    this->height = local_4c >> 0x10;
    local_42 = local_48._2_2_;
  }
  else {
    sVar2 = fread(local_50,0x28,1,__stream);
    if (sVar2 != 1) goto LAB_00103884;
    this->width = local_4c;
    this->height = local_48;
  }
  if (local_42 == 0x18) {
    this->paddingBytes = this->width & 3;
    pRVar3 = (RGB *)operator_new__((ulong)(this->width * this->height) * 3);
    this->rgbData = pRVar3;
    uVar5 = 0;
    fseek(__stream,(ulong)uStack_56,0);
    uVar1 = this->height;
    if (uVar1 != 0) {
      iVar6 = -1;
      do {
        uVar4 = this->width;
        sVar2 = fread(this->rgbData + (uVar1 + iVar6) * uVar4,3,(ulong)uVar4,__stream);
        if (sVar2 != uVar4) {
          printf("Error - something wrong when reading data from BMP file");
          if (this->rgbData == (RGB *)0x0) {
            return 0;
          }
          operator_delete__(this->rgbData);
          return 0;
        }
        fseek(__stream,(ulong)this->paddingBytes,1);
        uVar4 = (int)uVar5 + 1;
        uVar5 = (ulong)uVar4;
        uVar1 = this->height;
        iVar6 = iVar6 + -1;
      } while (uVar4 < uVar1);
    }
    fclose(__stream);
    return (int)CONCAT71((int7)(uVar5 >> 8),1);
  }
  __format = "Error - the picture format is not consistent with our programm";
LAB_0010388b:
  printf(__format);
  return 0;
}

Assistant:

bool BMPReader::open(std::string& path) {
	FILE* file = nullptr;

	if ((file = fopen(path.c_str(), "rb")) == nullptr) {
		printf("error occured when opening file:%s", path.c_str());
		return false;
	}

	BitMapFileHeader fileHeader;

	if (fread(&fileHeader, sizeof(fileHeader), 1, file) != 1) {
		printf("Error - error occured when reading BITMAPFILEHEADER");
		return false;
	}

	if(fileHeader.bfType != 0x4D42) {
		printf("Error - this is not a BMP file that you're reading");
		return false;
	}

	uint infoHeaderSize;
	fread(&infoHeaderSize, sizeof(infoHeaderSize), 1, file);
	fseek(file, -sizeof(infoHeaderSize), SEEK_CUR);
	//2中infoHeader, 通过size来判断
	if (infoHeaderSize == sizeof(BitMapCoreHeader)) {
		BitMapCoreHeader bitMapCoreHeader;
		if (fread(&bitMapCoreHeader, sizeof(bitMapCoreHeader), 1, file) != 1) {
			printf("Error - mal-structure BITMAPINFOHEADER");
			return false;
		}
		this->width = bitMapCoreHeader.bcWidth;
		this->height = bitMapCoreHeader.bcHeight;
		if (bitMapCoreHeader.bcBitCount != 24) {
			printf("Error - the picture format is not consistent with our programm");
			return false;
		}
	} else {
		BitMapInfoHeader bitMapInfoHeader;
		if (fread(&bitMapInfoHeader, sizeof(bitMapInfoHeader), 1, file) != 1) {
			printf("Error - mal-structure BITMAPINFOHEADER");
			return false;
		}
		this->width = bitMapInfoHeader.biWidth;
		this->height = bitMapInfoHeader.biHeight;
		if (bitMapInfoHeader.biBitCount != 24) {
			printf("Error - the picture format is not consistent with our programm");
			return false;
		}
	}
	//mutiple times of 4 bytes each row,
	// if width = 1, 1 * 3个像素 * 8位 = 24位, 差一个字节, paddingSize = 1
	// if width = 2, 2 * 3个 * 8位 = 48位  paddingSize = 2
	// if width = 3, paddingSize = 3
	// if width = 4, paddingSize = 0
	this->paddingBytes = width % 4;

	rgbData = new RGB[this->width * this->height];
	//跳到data数据的位置
	fseek(file, fileHeader.bfOffBits, SEEK_SET);
	for (uint i = 0; i < height; i++) {
		//read data
		if (width != fread(rgbData + (height - 1 - i) * width , sizeof(RGB), width, file)) {
			printf("Error - something wrong when reading data from BMP file");
			delete[] rgbData;
			return false;
		}
		fseek(file, paddingBytes, SEEK_CUR);
	}
	fclose(file);
	return true;
}